

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O3

void kv_set_var_nentry_test(btree_kv_ops *kv_ops)

{
  char cVar1;
  int iVar2;
  bnode *pbVar3;
  size_t __n;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t v;
  timeval __test_begin;
  char local_61;
  char local_60;
  undefined7 uStack_5f;
  anon_union_8_2_4f9aec01_for_bnode_4 *local_58;
  btree_kv_ops *local_50;
  char local_48 [8];
  timeval local_40;
  
  local_50 = kv_ops;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  memleak_start();
  pbVar3 = (bnode *)malloc(0x1010);
  pbVar3->kvsize = 0x801;
  pbVar3->flag = 0;
  pbVar3->level = 1;
  pbVar3->nentry = 10;
  (pbVar3->field_4).data = pbVar3 + 1;
  local_58 = &pbVar3->field_4;
  local_61 = 'd';
  uVar7 = 0;
  lVar5 = 0;
  do {
    sprintf(local_48,"key%d",uVar7);
    (*local_50->set_kv)(pbVar3,(idx_t)uVar7,local_48,&local_61);
    pvVar4 = (pbVar3->field_4).data;
    __n = strlen(local_48);
    iVar2 = bcmp((void *)((long)pvVar4 + lVar5),local_48,__n);
    if (iVar2 != 0) {
      kv_set_var_nentry_test();
      pvVar4 = (void *)CONCAT71(uStack_5f,local_60);
    }
    cVar1 = *(char *)((long)pvVar4 + lVar5 + 8);
    if (cVar1 != local_61) {
      kv_set_var_nentry_test();
      cVar1 = local_60;
    }
    lVar5 = lVar5 + 9;
    local_61 = cVar1 + '\x01';
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
  } while (uVar6 != 10);
  kv_set_var_nentry_test();
  return;
}

Assistant:

void kv_set_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v;
    idx_t idx;
    int n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    size_t offset = 0;
    char *key = alca(char, ksize);


    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    for (idx = 0; idx < n; idx ++){

        // set key/value
        sprintf(key, "key%d", idx);
        kv_ops->set_kv(node, idx, key, (void *)&v);

        // verify
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key, strlen(key)));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;

        // update value
        v++;

    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_test");
}